

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateVirtualTableUpdate
          (ExpressionContext *ctx,SynBase *source,VariableData *vtable,
          SmallArray<FunctionData_*,_32U> *functionSet,SmallArray<TypeClass_*,_32U> *classTypes)

{
  TypeFunction *pTVar1;
  FunctionData *pFVar2;
  ModuleData *pMVar3;
  TypeClass *type_00;
  TypeClass *pTVar4;
  TypeBase *pTVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  ExprBase *pEVar11;
  undefined4 extraout_var;
  ExprBase *node;
  _func_int **pp_Var12;
  char *pcVar13;
  undefined4 extraout_var_02;
  ulong uVar14;
  SmallArray<TypeClass_*,_32U> *pSVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  InplaceStr name_00;
  TypeBase *type;
  FunctionData *function;
  IntrusiveList<ExprBase> expressions;
  InplaceStr name;
  TraceScope traceScope;
  SmallArray<FunctionData_*,_32U> functions;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> assignments;
  TypeClass *local_3b0;
  SmallArray<TypeClass_*,_32U> *local_3a8;
  FunctionData *local_3a0;
  IntrusiveList<ExprBase> local_398;
  TypeBase *local_388;
  InplaceStr local_380;
  TraceScope local_370;
  SmallArray<FunctionData_*,_32U> local_360;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> local_248;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_3a8 = classTypes;
  if ((CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
       ::token == '\0') &&
     (iVar7 = __cxa_guard_acquire(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                                   ::token), iVar7 != 0)) {
    CreateVirtualTableUpdate::token = NULLC::TraceGetToken("analyze","CreateVirtualTableUpdate");
    __cxa_guard_release(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&local_370,CreateVirtualTableUpdate::token);
  local_398.head = (ExprBase *)0x0;
  local_398.tail = (ExprBase *)0x0;
  pcVar13 = (vtable->name->name).begin;
  local_380.begin = pcVar13 + 0xf;
  sVar9 = strlen(local_380.begin);
  local_380.end = pcVar13 + sVar9 + 0xf;
  uVar10 = strtoul(pcVar13 + 5,(char **)0x0,10);
  uVar14 = (ulong)(ctx->types).count;
  if (uVar14 != 0) {
    uVar17 = 0;
    do {
      pTVar1 = (TypeFunction *)(ctx->types).data[uVar17];
      if ((pTVar1->super_TypeBase).nameHash == (uint)uVar10) {
        if ((pTVar1->super_TypeBase).typeID == 0x15) {
          if (vtable->importModule == (ModuleData *)0x0) {
            name_00.end = "";
            name_00.begin = "__typeCount";
            pEVar11 = CreateFunctionCall0(ctx,source,name_00,false,true,true);
            pEVar11 = CreateArrayAllocation(ctx,source,ctx->typeFunctionID,pEVar11);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            ExprVariableAccess::ExprVariableAccess
                      ((ExprVariableAccess *)CONCAT44(extraout_var,iVar7),source,vtable->type,vtable
                      );
            pEVar11 = CreateAssignment(ctx,source,(ExprBase *)CONCAT44(extraout_var,iVar7),pEVar11);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            node = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
            local_388 = ctx->typeVoid;
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var12 = (_func_int **)CONCAT44(extraout_var_01,iVar7);
            *pp_Var12 = (_func_int *)0x0;
            pp_Var12[1] = (_func_int *)vtable;
            pp_Var12[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var12 + 3) = 0;
            node->typeID = 0x1e;
            node->source = source;
            node->type = local_388;
            node->next = (ExprBase *)0x0;
            node->listed = false;
            node->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
            node[1]._vptr_ExprBase = pp_Var12;
            *(ExprBase **)&node[1].typeID = pEVar11;
            IntrusiveList<ExprBase>::push_back(&local_398,node);
          }
          local_248.allocator = ctx->allocator;
          local_360.data = local_360.little;
          local_360.count = 0;
          local_360.max = 0x20;
          local_360.allocator = local_248.allocator;
          if (functionSet->count != 0) {
            uVar10 = 0;
            do {
              pFVar2 = functionSet->data[uVar10];
              pMVar3 = pFVar2->scope->ownerType->importModule;
              if (((pMVar3 == (ModuleData *)0x0) || (pMVar3 != vtable->importModule)) &&
                 (pFVar2->type == pTVar1)) {
                pcVar13 = strstr((pFVar2->name->name).begin,"::");
                local_248._0_8_ = pcVar13 + 2;
                sVar9 = strlen((char *)local_248._0_8_);
                local_248.data = (Node *)(pcVar13 + sVar9 + 2);
                bVar6 = InplaceStr::operator==((InplaceStr *)&local_248,&local_380);
                if (bVar6) {
                  if (local_360.count == local_360.max) {
                    SmallArray<FunctionData_*,_32U>::grow(&local_360,local_360.count);
                  }
                  if (local_360.data == (FunctionData **)0x0) {
                    __assert_fail("data",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                  ,0x162,
                                  "void SmallArray<FunctionData *, 32>::push_back(const T &) [T = FunctionData *, N = 32]"
                                 );
                  }
                  uVar14 = local_360._8_8_ & 0xffffffff;
                  local_360.count = local_360.count + 1;
                  local_360.data[uVar14] = pFVar2;
                }
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < functionSet->count);
            local_248.allocator = ctx->allocator;
          }
          local_248.data = local_248.storage;
          local_248._0_8_ = (char *)0x20;
          NULLC::fillMemory(local_248.data,0,0x200);
          if (local_360.count != 0) {
            uVar10 = 0;
            do {
              local_3a0 = local_360.data[uVar10];
              local_3b0 = (TypeClass *)local_3a0->scope->ownerType;
              pEVar11 = CreateVirtualTableAssignment
                                  (ctx,source,vtable,(TypeBase *)local_3b0,local_3a0);
              IntrusiveList<ExprBase>::push_back(&local_398,pEVar11);
              if ((local_3b0 != (TypeClass *)0x0) &&
                 ((local_3b0->super_TypeStruct).super_TypeBase.typeID == 0x18)) {
                SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                          (&local_248,(TypeBase **)&local_3b0,&local_3a0);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < (local_360._8_8_ & 0xffffffff));
          }
          uVar8 = local_3a8->count;
          if (uVar8 != 0) {
            uVar10 = 0;
            pSVar15 = local_3a8;
            do {
              type_00 = pSVar15->data[uVar10];
              if (local_248.bucketCount != 0) {
                uVar16 = (type_00->super_TypeStruct).super_TypeBase.nameHash;
                iVar7 = 0;
                uVar18 = local_248.bucketCount;
                do {
                  uVar16 = uVar16 & local_248.bucketCount - 1;
                  if ((TypeClass *)local_248.data[uVar16].key == (TypeClass *)0x0) break;
                  if ((TypeClass *)local_248.data[uVar16].key == type_00) goto LAB_00173d61;
                  uVar16 = uVar16 + iVar7 + 1;
                  iVar7 = iVar7 + 1;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              for (pTVar4 = type_00->baseClass; pTVar4 != (TypeClass *)0x0;
                  pTVar4 = pTVar4->baseClass) {
                if (local_248.bucketCount != 0) {
                  uVar16 = (pTVar4->super_TypeStruct).super_TypeBase.nameHash;
                  iVar7 = 0;
                  uVar14 = local_248._0_8_ & 0xffffffff;
                  do {
                    uVar16 = uVar16 & local_248.bucketCount - 1;
                    if ((TypeClass *)local_248.data[uVar16].key == (TypeClass *)0x0) break;
                    if ((TypeClass *)local_248.data[uVar16].key == pTVar4) {
                      local_3a0 = local_248.data[uVar16].value;
                      pEVar11 = CreateVirtualTableAssignment
                                          (ctx,source,vtable,(TypeBase *)type_00,local_3a0);
                      pSVar15 = local_3a8;
                      IntrusiveList<ExprBase>::push_back(&local_398,pEVar11);
                      local_3b0 = type_00;
                      SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                                (&local_248,(TypeBase **)&local_3b0,&local_3a0);
                      uVar8 = pSVar15->count;
                      goto LAB_00173d61;
                    }
                    uVar16 = uVar16 + iVar7 + 1;
                    iVar7 = iVar7 + 1;
                    uVar18 = (int)uVar14 - 1;
                    uVar14 = (ulong)uVar18;
                  } while (uVar18 != 0);
                }
                pSVar15 = local_3a8;
              }
LAB_00173d61:
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar8);
          }
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pEVar11 = (ExprBase *)CONCAT44(extraout_var_02,iVar7);
          pTVar5 = ctx->typeVoid;
          pEVar11->typeID = 0x36;
          pEVar11->source = source;
          pEVar11->type = pTVar5;
          pEVar11->next = (ExprBase *)0x0;
          pEVar11->listed = false;
          pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240b0;
          pEVar11[1]._vptr_ExprBase = (_func_int **)local_398.head;
          *(ExprBase **)&pEVar11[1].typeID = local_398.tail;
          pEVar11[1].source = (SynBase *)0x0;
          SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::~SmallDenseMap(&local_248)
          ;
          SmallArray<FunctionData_*,_32U>::~SmallArray(&local_360);
          NULLC::TraceScope::~TraceScope(&local_370);
          return pEVar11;
        }
        break;
      }
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  anon_unknown.dwarf_9c70f::Stop
            (ctx,source,"ERROR: Can\'t find function type for virtual function table \'%.*s\'",
             (ulong)(uint)(*(int *)&(vtable->name->name).end - (int)(vtable->name->name).begin));
}

Assistant:

ExprBase* CreateVirtualTableUpdate(ExpressionContext &ctx, SynBase *source, VariableData *vtable, SmallArray<FunctionData*, 32> &functionSet, SmallArray<TypeClass*, 32> &classTypes)
{
	TRACE_SCOPE("analyze", "CreateVirtualTableUpdate");

	IntrusiveList<ExprBase> expressions;

	// Find function name
	InplaceStr name = InplaceStr(vtable->name->name.begin + 15); // 15 to skip $vtbl0123456789 from name

	// Find function type from name
	unsigned typeNameHash = strtoul(vtable->name->name.begin + 5, NULL, 10);

	TypeBase *functionType = NULL;

	for(unsigned i = 0; i < ctx.types.size(); i++)
	{
		if(ctx.types[i]->nameHash == typeNameHash)
		{
			functionType = getType<TypeFunction>(ctx.types[i]);
			break;
		}
	}

	if(!functionType)
		Stop(ctx, source, "ERROR: Can't find function type for virtual function table '%.*s'", FMT_ISTR(vtable->name->name));

	if(vtable->importModule == NULL)
	{
		ExprBase *count = CreateFunctionCall0(ctx, source, InplaceStr("__typeCount"), false, true, true);

		ExprBase *alloc = CreateArrayAllocation(ctx, source, ctx.typeFunctionID, count);

		ExprBase *assignment = CreateAssignment(ctx, source, new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, vtable->type, vtable), alloc);

		expressions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, vtable), assignment));
	}

	// Find all functions with called name that are member functions and have target type
	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	for(unsigned i = 0; i < functionSet.size(); i++)
	{
		FunctionData *function = functionSet[i];

		TypeBase *parentType = function->scope->ownerType;

		// If both type and table are imported, then it should have been filled up inside the module for that type
		if(parentType->importModule && vtable->importModule && parentType->importModule == vtable->importModule)
			continue;

		if(function->type != functionType)
			continue;

		const char *pos = strstr(function->name->name.begin, "::");

		if(InplaceStr(pos + 2) == name)
			functions.push_back(function);
	}

	SmallDenseMap<TypeBase*, FunctionData*, TypeBaseHasher, 32> assignments(ctx.allocator);

	// Handle direct assignments
	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i];
		TypeBase *type = function->scope->ownerType;

		expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

		// Record that owner type recevied an assignment to this function
		if(isType<TypeClass>(type))
			assignments.insert(type, function);
	}

	// Handle derived classes
	for(unsigned i = 0; i < classTypes.size(); i++)
	{
		TypeClass *type = classTypes[i];

		// Already assigned
		if(assignments.find(type))
			continue;

		// Not assigned directly, walk through base classes
		for(TypeClass *curr = type->baseClass; curr; curr = curr->baseClass)
		{
			if(FunctionData **assignment = assignments.find(curr))
			{
				FunctionData *function = *assignment;

				expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

				assignments.insert(type, function);
				break;
			}
		}
	}

	return new (ctx.get<ExprBlock>()) ExprBlock(source, ctx.typeVoid, expressions, NULL);
}